

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * ApprovalTests::TestName::getRootDirectory_abi_cxx11_(void)

{
  ulong uVar1;
  string *psVar2;
  runtime_error *this;
  string *in_RDI;
  string local_28 [40];
  
  rootDirectoryStorage_abi_cxx11_();
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    psVar2 = rootDirectoryStorage_abi_cxx11_();
    ::std::__cxx11::string::string((string *)in_RDI,(string *)psVar2);
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  HelpMessages::getUnconfiguredRootDirectory_abi_cxx11_();
  ::std::runtime_error::runtime_error(this,local_28);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::string TestName::getRootDirectory()
    {
        if (!rootDirectoryStorage().empty())
        {
            return rootDirectoryStorage();
        }
        else
        {
            throw std::runtime_error(HelpMessages::getUnconfiguredRootDirectory());
        }
    }